

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::asBool(Value *this)

{
  runtime_error *this_00;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._7_1_ = false;
    break;
  case 1:
    this_local._7_1_ = (this->value_).int_ != 0;
    break;
  case 2:
    this_local._7_1_ = (this->value_).int_ != 0;
    break;
  case 3:
    this_local._7_1_ = (this->value_).real_ != 0.0;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to bool.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    this_local._7_1_ = (bool)((this->value_).bool_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Value::asBool() const {
  switch (type_) {
  case booleanValue:
    return value_.bool_;
  case nullValue:
    return false;
  case intValue:
    return value_.int_ ? true : false;
  case uintValue:
    return value_.uint_ ? true : false;
  case realValue:
    return value_.real_ ? true : false;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to bool.");
}